

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

type __thiscall
httplib::detail::
make_unique<httplib::ClientImpl,char_const*&,int,std::__cxx11::string_const&,std::__cxx11::string_const&>
          (detail *this,char **args,int *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3)

{
  ClientImpl *this_00;
  allocator<char> local_51;
  string local_50;
  
  this_00 = (ClientImpl *)operator_new(0x2b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,*args,&local_51);
  ClientImpl::ClientImpl(this_00,&local_50,*args_1,args_2,args_3);
  *(ClientImpl **)this = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<httplib::ClientImpl,_std::default_delete<httplib::ClientImpl>,_true,_true>
         )(__uniq_ptr_data<httplib::ClientImpl,_std::default_delete<httplib::ClientImpl>,_true,_true>
           )this;
}

Assistant:

typename std::enable_if<!std::is_array<T>::value, std::unique_ptr<T>>::type
		make_unique(Args &&... args) {
			return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
		}